

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

void __thiscall
GenericModelPrivate::encodeMime(GenericModelPrivate *this,QMimeData *data,QModelIndexList *indexes)

{
  long lVar1;
  QModelIndex *pQVar2;
  Span *pSVar3;
  type tVar4;
  QModelIndex *pQVar5;
  Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *pDVar6;
  GenericModelItem **ppGVar7;
  ulong uVar8;
  QAbstractItemModel **ppQVar9;
  int iVar10;
  type tVar11;
  type tVar12;
  QHash<GenericModelItem_*,_QHashDummyValue> QVar13;
  Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *pDVar14;
  size_t sVar15;
  ulong uVar16;
  bool bVar17;
  piter it;
  piter it_00;
  QSet<GenericModelItem_*> itemsToSave;
  QByteArray encoded;
  QDataStream stream;
  QHash<GenericModelItem_*,_QHashDummyValue> local_90;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QMimeData *local_70;
  GenericModelItem *local_68 [4];
  QByteArray local_48;
  
  local_90.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
  lVar1 = (indexes->d).size;
  local_70 = data;
  if (lVar1 != 0) {
    pQVar2 = (indexes->d).ptr;
    ppQVar9 = &pQVar2->m;
    do {
      bVar17 = -1 < (*(int *)((long)ppQVar9 + -0xc) | ((QModelIndex *)(ppQVar9 + -2))->r);
      if ((bVar17) && (*ppQVar9 != (QAbstractItemModel *)0x0)) {
        ppGVar7 = &this->root;
        if (*ppQVar9 != (QAbstractItemModel *)0x0) {
          ppGVar7 = (GenericModelItem **)(ppQVar9 + -1);
        }
        if (!bVar17) {
          ppGVar7 = &this->root;
        }
        local_68[0] = *ppGVar7;
        QHash<GenericModelItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<GenericModelItem*,QHashDummyValue> *)&local_90,local_68,
                   (QHashDummyValue *)&local_88);
      }
      pQVar5 = (QModelIndex *)(ppQVar9 + 1);
      ppQVar9 = ppQVar9 + 3;
    } while (pQVar5 != pQVar2 + lVar1);
  }
  if ((local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
     (1 < (uint)((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    local_90.d = QHashPrivate::Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::
                 detached(local_90.d,0);
  }
  QVar13.d = local_90.d;
  if ((local_90.d)->spans->offsets[0] == 0xff) {
    uVar8 = 1;
    do {
      sVar15 = uVar8;
      if ((local_90.d)->numBuckets == sVar15) {
        QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
        sVar15 = 0;
        break;
      }
      uVar8 = sVar15 + 1;
    } while ((local_90.d)->spans[sVar15 >> 7].offsets[(uint)sVar15 & 0x7f] == 0xff);
  }
  else {
    sVar15 = 0;
  }
  it_00.bucket = sVar15;
  it_00.d = QVar13.d;
  if (QVar13.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0 ||
      sVar15 != 0) {
    do {
      uVar16 = it_00.bucket;
      pDVar14 = it_00.d;
      uVar8 = uVar16;
      do {
        if (pDVar14->numBuckets - 1 == uVar8) {
          uVar8 = 0;
          pDVar6 = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
          break;
        }
        uVar8 = uVar8 + 1;
        pDVar6 = pDVar14;
      } while (pDVar14->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      it.bucket = uVar8;
      it.d = pDVar6;
      if ((pDVar6 != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
         (uVar8 != 0)) {
        do {
          uVar8 = it.bucket;
          pDVar6 = it.d;
          tVar11 = pDVar14->spans[uVar16 >> 7].entries
                   [pDVar14->spans[uVar16 >> 7].offsets[(uint)it_00.bucket & 0x7f]].storage;
          pSVar3 = pDVar6->spans;
          tVar4 = pSVar3[uVar8 >> 7].entries[pSVar3[uVar8 >> 7].offsets[(uint)it.bucket & 0x7f]].
                  storage;
          if (tVar4 == (type)0x0) {
LAB_001305a1:
            bVar17 = tVar11 != (type)0x0;
            if ((tVar11 == (type)0x0) || (tVar4 == (type)0x0)) {
LAB_001305c9:
              if (bVar17) {
                it_00 = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::erase
                                         (&local_90,(const_iterator)it_00);
                goto LAB_00130661;
              }
            }
            else if (tVar4 != tVar11) {
              do {
                tVar11 = *(type *)((long)tVar11 + 8);
                bVar17 = tVar11 != (type)0x0;
                if (tVar11 == tVar4) break;
              } while (tVar11 != (type)0x0);
              goto LAB_001305c9;
            }
            do {
              if (pDVar6->numBuckets - 1 == uVar8) {
                it = (piter)ZEXT816(0);
                break;
              }
              uVar8 = uVar8 + 1;
              it.bucket = uVar8;
              it.d = pDVar6;
            } while (pSVar3[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
          }
          else {
            if (tVar11 != (type)0x0) {
              tVar12 = tVar4;
              if (tVar11 != tVar4) {
                do {
                  tVar12 = *(type *)((long)tVar12 + 8);
                  if (tVar12 == tVar11) break;
                } while (tVar12 != (type)0x0);
                if (tVar12 != (type)0x0) goto LAB_00130594;
              }
              goto LAB_001305a1;
            }
LAB_00130594:
            it = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::erase
                                  (&local_90,(const_iterator)it);
          }
        } while ((it.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
                (it.bucket != 0));
      }
      do {
        if (pDVar14->numBuckets - 1 == uVar16) {
          it_00 = (piter)ZEXT816(0);
          break;
        }
        uVar16 = uVar16 + 1;
        it_00.bucket = uVar16;
        it_00.d = pDVar14;
      } while (pDVar14->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
LAB_00130661:
    } while ((it_00.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
            (it_00.bucket != 0));
  }
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  QDataStream::QDataStream((QDataStream *)local_68,&local_88,2);
  if (local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) {
    iVar10 = 0;
  }
  else {
    iVar10 = (int)(local_90.d)->size;
  }
  QDataStream::operator<<((QDataStream *)local_68,iVar10);
  if ((local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
     (1 < (uint)((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    local_90.d = QHashPrivate::Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::
                 detached(local_90.d,0);
  }
  QVar13.d = local_90.d;
  if ((local_90.d)->spans->offsets[0] == 0xff) {
    uVar8 = 1;
    do {
      uVar16 = uVar8;
      if ((local_90.d)->numBuckets == uVar16) {
        uVar16 = 0;
        QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
        break;
      }
      uVar8 = uVar16 + 1;
    } while ((local_90.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
  }
  else {
    uVar16 = 0;
  }
  if (QVar13.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0 ||
      uVar16 != 0) {
    do {
      ::operator<<((QDataStream *)local_68,
                   (GenericModelItem *)
                   (QVar13.d)->spans[uVar16 >> 7].entries
                   [(QVar13.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f]].storage);
      do {
        if ((QVar13.d)->numBuckets - 1 == uVar16) {
          QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
          uVar16 = 0;
          break;
        }
        uVar16 = uVar16 + 1;
      } while ((QVar13.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    } while ((QVar13.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
            (uVar16 != 0));
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = "application/x-genericmodeldatalist";
  local_48.d.size = 0x22;
  QMimeData::setData((QString *)local_70,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  QDataStream::~QDataStream((QDataStream *)local_68);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,1,8);
    }
  }
  QHash<GenericModelItem_*,_QHashDummyValue>::~QHash(&local_90);
  return;
}

Assistant:

void GenericModelPrivate::encodeMime(QMimeData *data, const QModelIndexList &indexes) const
{
    Q_ASSERT(data);
    Q_Q(const GenericModel);
    QSet<GenericModelItem *> itemsToSave;
    for (auto &&idx : indexes) {
        if (!idx.isValid())
            continue;
        Q_ASSERT(idx.model() == q);
        itemsToSave << itemForIndex(idx);
    }
    for (auto i = itemsToSave.begin(); i != itemsToSave.end();) {
        bool iToErase = false;
        auto j = i;
        for (++j; j != itemsToSave.end();) {
            if (GenericModelItem::isAnchestor(*i, *j)) {
                j = itemsToSave.erase(j);
                continue;
            }
            if (GenericModelItem::isAnchestor(*j, *i)) {
                iToErase = true;
                break;
            }
            ++j;
        }
        if (iToErase)
            i = itemsToSave.erase(i);
        else
            ++i;
    }
    QByteArray encoded;
    QDataStream stream(&encoded, QIODevice::WriteOnly);
    stream << qint32(itemsToSave.size());
    for (auto i = itemsToSave.begin(); i != itemsToSave.end(); ++i)
        stream << **i;
    data->setData(mimeDataName(), encoded);
}